

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O1

bool __thiscall SVGChart::PPlot::CalculateTickInfo(PPlot *this,PRect *inRect,Painter *inPainter)

{
  TickInfo *ioTickInfo;
  TickInfo *ioTickInfo_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  PPlot *this_00;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar6 = (this->mXAxisSetup).mMax - (this->mXAxisSetup).mMin;
  if (fVar6 <= 0.0) {
    return false;
  }
  fVar4 = (this->mYAxisSetup).mMin;
  fVar3 = (this->mYAxisSetup).mMax;
  fVar5 = fVar3 - fVar4;
  if (fVar5 < 0.0) {
    return false;
  }
  if ((((fVar3 != 0.0) || (NAN(fVar3))) && (ABS(fVar5 / fVar3) < 0.001)) ||
     ((fVar5 == 0.0 && (!NAN(fVar5))))) {
    fVar5 = (float)(~-(uint)(fVar3 != 0.0) & 0x3dcccccd |
                   (uint)(ABS(fVar3) * 0.1) & -(uint)(fVar3 != 0.0));
    fVar3 = fVar3 + fVar5;
    (this->mYAxisSetup).mMax = fVar3;
    fVar4 = fVar4 - fVar5;
    (this->mYAxisSetup).mMin = fVar4;
    fVar5 = fVar3 - fVar4;
  }
  ioTickInfo = &(this->mXAxisSetup).mTickInfo;
  if ((this->mXAxisSetup).mTickInfo.mAutoTick == true) {
    iVar2 = (*inPainter->_vptr_Painter[8])(inPainter,"12345");
    iVar2 = (*this->mXTickIterator->_vptr_TickIterator[4])
                      (fVar6,(float)inRect->mH,(float)inRect->mW / ((float)iVar2 + (float)iVar2),
                       this->mXTickIterator,ioTickInfo);
    if ((char)iVar2 != '\0') goto LAB_00107ca3;
LAB_00107d2b:
    bVar1 = false;
  }
  else {
LAB_00107ca3:
    ioTickInfo_00 = &(this->mYAxisSetup).mTickInfo;
    if ((this->mYAxisSetup).mTickInfo.mAutoTick == true) {
      iVar2 = (*inPainter->_vptr_Painter[9])(inPainter);
      iVar2 = (*this->mYTickIterator->_vptr_TickIterator[4])
                        (fVar5,(float)inRect->mW,
                         (float)inRect->mH / ((float)CONCAT44(extraout_var,iVar2) * 3.0),
                         this->mYTickIterator,ioTickInfo_00);
      if ((char)iVar2 == '\0') goto LAB_00107d2b;
    }
    this_00 = (PPlot *)inPainter;
    iVar2 = (*inPainter->_vptr_Painter[9])();
    SetTickSizes(this_00,iVar2,ioTickInfo);
    iVar2 = (*inPainter->_vptr_Painter[9])();
    SetTickSizes((PPlot *)inPainter,iVar2,ioTickInfo_00);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool PPlot::CalculateTickInfo (const PRect &inRect, Painter &inPainter) {
      float theXRange = mXAxisSetup.mMax - mXAxisSetup.mMin;
      float theYRange = mYAxisSetup.mMax - mYAxisSetup.mMin;

      if (theXRange <= 0 || theYRange < 0) {
        return false;
      }

      if ((mYAxisSetup.mMax != 0 && fabs (theYRange / mYAxisSetup.mMax) < kRangeVerySmall) ||
        theYRange == 0) {
        float delta = 0.1f;
        if (mYAxisSetup.mMax != 0) {
            delta *= fabs(mYAxisSetup.mMax);
        }
        
        mYAxisSetup.mMax += delta;
        mYAxisSetup.mMin -= delta;
        theYRange = mYAxisSetup.mMax - mYAxisSetup.mMin;
      }

      if (mXAxisSetup.mTickInfo.mAutoTick) {
        int theTextWidth = inPainter.CalculateTextDrawSize ("12345");
        float theDivGuess = inRect.mW/(kMajorTickXInitialFac*theTextWidth);
        if (!mXTickIterator->InitFromRanges (theXRange, inRect.mH, theDivGuess, mXAxisSetup.mTickInfo)) {
          return false;
        }
      }
      if (mYAxisSetup.mTickInfo.mAutoTick) {
        float theTextHeight = inPainter.GetFontHeight ();
        float theDivGuess = inRect.mH/(kMajorTickYInitialFac*theTextHeight);
        if (!mYTickIterator->InitFromRanges (theYRange, inRect.mW, theDivGuess, mYAxisSetup.mTickInfo)) {
          return false;
        }
      }

      SetTickSizes (inPainter.GetFontHeight (), mXAxisSetup.mTickInfo);
      SetTickSizes (inPainter.GetFontHeight (), mYAxisSetup.mTickInfo);

      return true;
    }